

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

void av1_restore_uv_color_map(AV1_COMP *cpi,MACROBLOCK *x)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  PALETTE_BUFFER *pPVar7;
  uint8_t *puVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  long lVar13;
  int16_t *piVar14;
  uint16_t *puVar15;
  uint uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  long lVar19;
  int16_t *piVar20;
  uint8_t *puVar21;
  long lVar22;
  ulong uVar23;
  ushort uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  size_t __n;
  int16_t centroids [16];
  long local_c8;
  uint local_98;
  int16_t local_58 [20];
  ulong uVar12;
  
  pMVar6 = *(x->e_mbd).mi;
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  iVar5 = (x->e_mbd).mb_to_right_edge;
  bVar1 = (byte)(x->e_mbd).plane[1].subsampling_x;
  bVar2 = (byte)(x->e_mbd).plane[1].subsampling_y;
  bVar9 = block_size_wide[pMVar6->bsize] >> (bVar1 & 0x1f);
  bVar10 = block_size_high[pMVar6->bsize] >> (bVar2 & 0x1f);
  pPVar7 = x->palette_buffer;
  piVar20 = pPVar7->kmeans_data_buf;
  puVar8 = (x->e_mbd).plane[1].color_index_map;
  uVar25 = (int)((iVar4 >> 0x1f & iVar4 >> 3) + (uint)block_size_high[pMVar6->bsize]) >>
           (bVar2 & 0x1f);
  uVar29 = (int)((iVar5 >> 0x1f & iVar5 >> 3) + (uint)block_size_wide[pMVar6->bsize]) >>
           (bVar1 & 0x1f);
  iVar4 = (uint)(bVar10 < 4) * 2;
  uVar16 = uVar29 + (uint)(bVar9 < 4) * 2;
  uVar11 = iVar4 + uVar25;
  uVar12 = (ulong)uVar11;
  if (uVar11 != 0 && SCARRY4(iVar4,uVar25) == (int)uVar11 < 0) {
    lVar13 = (long)x->plane[1].src.stride;
    puVar18 = x->plane[1].src.buf;
    puVar21 = x->plane[2].src.buf;
    lVar22 = (long)puVar18 * 2;
    lVar27 = (long)puVar21 * 2;
    uVar28 = (ulong)uVar16;
    local_c8 = 0;
    uVar23 = 0;
    piVar14 = piVar20;
    do {
      if (0 < (int)uVar16) {
        uVar3 = ((cpi->common).seq_params)->use_highbitdepth;
        uVar17 = 0;
        lVar30 = local_c8;
        do {
          if (uVar3 == '\0') {
            piVar14[uVar17 * 2] = (ushort)puVar18[uVar17];
            uVar24 = (ushort)puVar21[uVar17];
            lVar19 = lVar30;
          }
          else {
            piVar14[uVar17 * 2] = *(int16_t *)(lVar22 + uVar17 * 2);
            uVar24 = *(ushort *)(lVar27 + uVar17 * 2);
            lVar19 = (uVar17 + uVar23 * uVar28) * 2;
          }
          pPVar7->kmeans_data_buf[lVar19 + 1] = uVar24;
          uVar17 = uVar17 + 1;
          lVar30 = lVar30 + 2;
        } while (uVar28 != uVar17);
      }
      uVar23 = uVar23 + 1;
      local_c8 = local_c8 + uVar28 * 2;
      piVar14 = piVar14 + uVar28 * 2;
      puVar18 = puVar18 + lVar13;
      puVar21 = puVar21 + lVar13;
      lVar22 = lVar22 + lVar13 * 2;
      lVar27 = lVar27 + lVar13 * 2;
    } while (uVar23 != uVar12);
  }
  uVar26 = (uint)bVar9 + (uint)(bVar9 < 4) * 2;
  puVar15 = (pMVar6->palette_mode_info).palette_colors;
  lVar22 = 1;
  piVar14 = local_58;
  do {
    puVar15 = puVar15 + 8;
    if ((pMVar6->palette_mode_info).palette_size[1] != '\0') {
      uVar23 = 0;
      do {
        piVar14[uVar23 * 2] = puVar15[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar23 < (pMVar6->palette_mode_info).palette_size[1]);
    }
    lVar22 = lVar22 + 1;
    piVar14 = piVar14 + 1;
  } while (lVar22 != 3);
  (*av1_calc_indices_dim2)
            (piVar20,local_58,puVar8,(int64_t *)0x0,uVar11 * uVar16,
             (int)(pMVar6->palette_mode_info).palette_size[1]);
  if ((bVar10 != uVar25) || (bVar9 != uVar29)) {
    uVar23 = (ulong)uVar26;
    if (0 < (int)uVar11) {
      __n = (size_t)(int)uVar16;
      lVar22 = uVar12 + 1;
      puVar18 = puVar8 + (uVar12 - 1) * __n;
      puVar21 = puVar8 + (uVar12 - 1) * uVar23;
      do {
        memmove(puVar21,puVar18,__n);
        memset(puVar21 + __n,(uint)puVar21[__n - 1],(long)(int)(uVar26 - uVar16));
        lVar22 = lVar22 + -1;
        puVar18 = puVar18 + -__n;
        puVar21 = puVar21 + -uVar23;
      } while (1 < lVar22);
    }
    local_98 = (uint)bVar10;
    if ((int)uVar25 < (int)local_98) {
      lVar22 = (ulong)((uint)bVar10 + (uint)(bVar10 < 4) * 2) - (long)(int)uVar11;
      puVar18 = puVar8 + (long)(int)uVar11 * uVar23;
      do {
        memcpy(puVar18,puVar8 + (int)((uVar11 - 1) * uVar26),uVar23);
        puVar18 = puVar18 + uVar23;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
  }
  return;
}

Assistant:

void av1_restore_uv_color_map(const AV1_COMP *cpi, MACROBLOCK *x) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const BLOCK_SIZE bsize = mbmi->bsize;
  int src_stride = x->plane[1].src.stride;
  const uint8_t *const src_u = x->plane[1].src.buf;
  const uint8_t *const src_v = x->plane[2].src.buf;
  int16_t *const data = x->palette_buffer->kmeans_data_buf;
  int16_t centroids[2 * PALETTE_MAX_SIZE];
  uint8_t *const color_map = xd->plane[1].color_index_map;
  int r, c;
  const uint16_t *const src_u16 = CONVERT_TO_SHORTPTR(src_u);
  const uint16_t *const src_v16 = CONVERT_TO_SHORTPTR(src_v);
  int plane_block_width, plane_block_height, rows, cols;
  av1_get_block_dimensions(bsize, 1, xd, &plane_block_width,
                           &plane_block_height, &rows, &cols);

  for (r = 0; r < rows; ++r) {
    for (c = 0; c < cols; ++c) {
      if (cpi->common.seq_params->use_highbitdepth) {
        data[(r * cols + c) * 2] = src_u16[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v16[r * src_stride + c];
      } else {
        data[(r * cols + c) * 2] = src_u[r * src_stride + c];
        data[(r * cols + c) * 2 + 1] = src_v[r * src_stride + c];
      }
    }
  }

  for (r = 1; r < 3; ++r) {
    for (c = 0; c < pmi->palette_size[1]; ++c) {
      centroids[c * 2 + r - 1] = pmi->palette_colors[r * PALETTE_MAX_SIZE + c];
    }
  }

  av1_calc_indices(data, centroids, color_map, rows * cols,
                   pmi->palette_size[1], 2);
  extend_palette_color_map(color_map, cols, rows, plane_block_width,
                           plane_block_height);
}